

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_2::BasicSharedVarCase::BasicSharedVarCase
          (BasicSharedVarCase *this,Context *context,char *name,char *description,IVec3 *localSize,
          IVec3 *workSize)

{
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,"Basic shared variable usage");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e623f8;
  tcu::Vector<int,_3>::Vector(&this->m_localSize,(Vector<int,_3> *)description);
  tcu::Vector<int,_3>::Vector(&this->m_workSize,localSize);
  return;
}

Assistant:

BasicSharedVarCase (Context& context, const char* name, const char* description, const tcu::IVec3& localSize, const tcu::IVec3& workSize)
		: TestCase		(context, name, description)
		, m_localSize	(localSize)
		, m_workSize	(workSize)
	{
	}